

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::OuterProduct<4,_2>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<4,_2> *this,EvalContext *ctx,IArgs *iargs)

{
  Vector<tcu::Interval,_2> *pVVar1;
  bool bVar2;
  Mul *pMVar3;
  long lVar4;
  bool bVar5;
  bool *pbVar6;
  undefined1 local_8a;
  undefined1 local_89;
  IRet *local_88;
  long local_80;
  Interval *local_78;
  long local_70;
  bool *local_68;
  Interval *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  local_88 = __return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(__return_storage_ptr__);
  local_80 = 0;
  do {
    local_78 = (local_88->m_data).m_data[0].m_data + local_80;
    local_70 = local_80 * 0x18;
    lVar4 = 0;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      pbVar6 = &iargs->a->m_data[0].m_hasNaN + local_70;
      pVVar1 = iargs->b;
      pMVar3 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Mul>();
      local_50 = &local_8a;
      local_58 = &local_89;
      local_68 = pbVar6;
      local_60 = pVVar1->m_data + lVar4;
      (**(code **)((long)*pMVar3 + 0x40))(&local_48,pMVar3,ctx,&local_68);
      local_78[lVar4 * 4].m_hi = local_38;
      *(undefined8 *)(local_78 + lVar4 * 4) = local_48;
      local_78[lVar4 * 4].m_lo = dStack_40;
      lVar4 = 1;
      bVar2 = false;
    } while (bVar5);
    local_80 = local_80 + 1;
  } while (local_80 != 4);
  return local_88;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}